

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PyCode.cc
# Opt level: O1

int __thiscall PyCode::mainFunc(PyCode *this,string *cwd)

{
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  char *pcVar4;
  ostream *poVar5;
  int extraout_EDX;
  string *psVar6;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,">>Now generating MFStruct.py",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  pcVar1 = (cwd->_M_dataplus)._M_p;
  psVar6 = &local_40;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)psVar6,pcVar1,pcVar1 + cwd->_M_string_length);
  generateMFStructPy((PyCode *)psVar6,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,">>Now generating PostrgresCon.py",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  pcVar1 = (cwd->_M_dataplus)._M_p;
  psVar6 = &local_60;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)psVar6,pcVar1,pcVar1 + cwd->_M_string_length);
  generatePostgresConPy((PyCode *)psVar6,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,">>Now generating Main.py",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  pcVar1 = (cwd->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + cwd->_M_string_length);
  generateMainPy(this,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  pcVar1 = (cwd->_M_dataplus)._M_p;
  psVar6 = &local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)psVar6,pcVar1,pcVar1 + cwd->_M_string_length);
  iVar2 = generateRequirements((PyCode *)psVar6,&local_a0);
  if (extraout_EDX == 2) {
    plVar3 = (long *)__cxa_begin_catch(iVar2);
    pcVar4 = (char *)(**(code **)(*plVar3 + 0x10))(plVar3);
    poVar5 = std::operator<<((ostream *)&std::cout,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
    __cxa_end_catch();
    return -1;
  }
  __clang_call_terminate(iVar2);
}

Assistant:

int PyCode::mainFunc(std::string cwd) noexcept
{
    try
    {
        std::cout << ">>Now generating MFStruct.py" << std::endl;
        this->generateMFStructPy(cwd);
        std::cout << ">>Now generating PostrgresCon.py" << std::endl;
        this->generatePostgresConPy(cwd);
        std::cout << ">>Now generating Main.py" << std::endl;
        this->generateMainPy(cwd);
        this->generateRequirements(cwd);
    }
    catch(ParserClassException::FileNotOpenException &e)
    {
        std::cout << e.what() << std::endl;
        return -1;
    }
    return 0;
}